

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int doctype1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  
  if (tok < 0x12) {
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x11) {
      pcVar2 = prolog2;
      iVar3 = 7;
      goto LAB_004e37eb;
    }
LAB_004e377c:
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  else {
    if (tok != 0x12) {
      if (tok == 0x19) {
        pcVar2 = internalSubset;
        iVar3 = 6;
        goto LAB_004e37eb;
      }
      goto LAB_004e377c;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"SYSTEM");
    iVar3 = 0;
    if (iVar1 != 0) {
      pcVar2 = doctype3;
      iVar3 = 0;
      goto LAB_004e37eb;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr,end,"PUBLIC");
    if (iVar1 != 0) {
      pcVar2 = doctype2;
      goto LAB_004e37eb;
    }
  }
  pcVar2 = error;
  iVar3 = -1;
LAB_004e37eb:
  state->handler = pcVar2;
  return iVar3;
}

Assistant:

static
int doctype1(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_OPEN_BRACKET:
    state->handler = internalSubset;
    return XML_ROLE_DOCTYPE_INTERNAL_SUBSET;
  case XML_TOK_DECL_CLOSE:
    state->handler = prolog2;
    return XML_ROLE_DOCTYPE_CLOSE;
  case XML_TOK_NAME:
    if (XmlNameMatchesAscii(enc, ptr, end, KW_SYSTEM)) {
      state->handler = doctype3;
      return XML_ROLE_NONE;
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_PUBLIC)) {
      state->handler = doctype2;
      return XML_ROLE_NONE;
    }
    break;
  }
  return common(state, tok);
}